

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OPL3.cpp
# Opt level: O1

void __thiscall OPL3::initOperators(OPL3 *this)

{
  long lVar1;
  Operator *pOVar2;
  int offset;
  long lVar3;
  ulong uVar4;
  Operator *(*__s) [32];
  Operator *(*papOVar5) [32];
  int iVar6;
  int iVar7;
  bool bVar8;
  
  __s = this->operators;
  iVar6 = 0;
  memset(__s,0,0x200);
  lVar1 = 0;
  do {
    uVar4 = 0;
    papOVar5 = __s;
    iVar7 = iVar6;
    do {
      lVar3 = 0;
      do {
        pOVar2 = (Operator *)operator_new(0xb8);
        (pOVar2->phaseGenerator).phase = 0.0;
        (pOVar2->phaseGenerator).phaseIncrement = 0.0;
        (pOVar2->envelopeGenerator).stage = OFF;
        (pOVar2->envelopeGenerator).actualAttackRate = 0;
        (pOVar2->envelopeGenerator).actualDecayRate = 0;
        *(undefined8 *)&(pOVar2->envelopeGenerator).actualReleaseRate = 0;
        *(undefined8 *)((long)&(pOVar2->envelopeGenerator).xAttackIncrement + 4) = 0;
        *(undefined8 *)((long)&(pOVar2->envelopeGenerator).xMinimumInAttack + 4) = 0;
        *(undefined8 *)((long)&(pOVar2->envelopeGenerator).dBdecayIncrement + 4) = 0;
        *(undefined8 *)((long)&(pOVar2->envelopeGenerator).dBreleaseIncrement + 4) = 0;
        *(undefined8 *)((long)&(pOVar2->envelopeGenerator).attenuation + 4) = 0;
        *(undefined8 *)((long)&(pOVar2->envelopeGenerator).totalLevel + 4) = 0;
        *(undefined4 *)((long)&(pOVar2->envelopeGenerator).sustainLevel + 4) = 0;
        (pOVar2->envelopeGenerator).x = 6.584962500721156;
        (pOVar2->envelopeGenerator).envelope = -96.0;
        pOVar2->operatorBaseAddress = iVar7 + (int)lVar3;
        pOVar2->envelope = 0.0;
        pOVar2->am = 0;
        pOVar2->vib = 0;
        pOVar2->ksr = 0;
        pOVar2->egt = 0;
        pOVar2->mult = 0;
        pOVar2->ksl = 0;
        pOVar2->tl = 0;
        pOVar2->ar = 0;
        pOVar2->dr = 0;
        pOVar2->sl = 0;
        pOVar2->rr = 0;
        pOVar2->ws = 0;
        pOVar2->ws = 0;
        pOVar2->keyScaleNumber = 0;
        pOVar2->f_number = 0;
        pOVar2->block = 0;
        (*papOVar5)[lVar3] = pOVar2;
        lVar3 = lVar3 + 1;
      } while (lVar3 != 6);
      iVar7 = iVar7 + 8;
      papOVar5 = (Operator *(*) [32])(*papOVar5 + 8);
      bVar8 = uVar4 < 9;
      uVar4 = uVar4 + 8;
    } while (bVar8);
    iVar6 = iVar6 + 0x100;
    __s = __s + 1;
    bVar8 = lVar1 == 0;
    lVar1 = lVar1 + 1;
  } while (bVar8);
  pOVar2 = this->operators[0][0x12];
  this->highHatOperatorInNonRhythmMode = this->operators[0][0x11];
  this->snareDrumOperatorInNonRhythmMode = this->operators[0][0x14];
  this->tomTomOperatorInNonRhythmMode = pOVar2;
  this->topCymbalOperatorInNonRhythmMode = this->operators[0][0x15];
  return;
}

Assistant:

void OPL3::initOperators() {
    int baseAddress;
    // The YMF262 has 36 operators:
	memset(operators, 0, sizeof(operators));
    for(int array=0; array<2; array++)
        for(int group = 0; group<=0x10; group+=8)
            for(int offset=0; offset<6; offset++) {
                baseAddress = (array<<8) | (group+offset);
                operators[array][group+offset] = new Operator(baseAddress);
            }
    
    // Save operators when they are in non-rhythm mode:
    // Channel 7:
    highHatOperatorInNonRhythmMode = operators[0][0x11];
    snareDrumOperatorInNonRhythmMode = operators[0][0x14];
    // Channel 8:
    tomTomOperatorInNonRhythmMode = operators[0][0x12];
    topCymbalOperatorInNonRhythmMode = operators[0][0x15];
    
}